

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O2

void __thiscall
bloaty::RollupOutput::PrintToCSV(RollupOutput *this,ostream *out,bool tabs,bool csvDiff)

{
  pointer pRVar1;
  ostream *poVar2;
  char *__s;
  char *in_R8;
  pointer row;
  string_view separator;
  string sep;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  ostream *local_70;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_70 = out;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_88,&this->source_names_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"vmsize",(allocator<char> *)&local_68);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_88,
             &local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"filesize",(allocator<char> *)&local_68);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_88,
             &local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  if (csvDiff) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"original_vmsize",(allocator<char> *)&local_68);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_88,
               &local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"original_filesize",(allocator<char> *)&local_68);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_88,
               &local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"current_vmsize",(allocator<char> *)&local_68);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_88,
               &local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"current_filesize",(allocator<char> *)&local_68);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_88,
               &local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  __s = ",";
  if (tabs) {
    __s = anon_var_dwarf_2d61d8 + 0x11;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,__s,(allocator<char> *)&local_68);
  separator._M_str = in_R8;
  separator._M_len = (size_t)local_a8._M_dataplus._M_p;
  absl::strings_internal::
  JoinRange<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_68,(strings_internal *)&local_88,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_a8._M_string_length,separator);
  poVar2 = std::operator<<(local_70,(string *)&local_68);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)&local_68);
  pRVar1 = (this->toplevel_row_).sorted_children.
           super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (row = (this->toplevel_row_).sorted_children.
             super__Vector_base<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>._M_impl.
             super__Vector_impl_data._M_start; row != pRVar1; row = row + 1) {
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    PrintTreeToCSV(this,row,&local_48,local_70,tabs,csvDiff);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
  }
  std::__cxx11::string::~string((string *)&local_a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  return;
}

Assistant:

void RollupOutput::PrintToCSV(std::ostream* out, bool tabs,
                              bool csvDiff) const {
  std::vector<std::string> names(source_names_);
  names.push_back("vmsize");
  names.push_back("filesize");
  if (csvDiff) {
    names.push_back("original_vmsize");
    names.push_back("original_filesize");
    names.push_back("current_vmsize");
    names.push_back("current_filesize");
  }
  std::string sep = tabs ? "\t" : ",";
  *out << absl::StrJoin(names, sep) << "\n";
  for (const auto& child_row : toplevel_row_.sorted_children) {
    PrintTreeToCSV(child_row, std::vector<std::string>(), out, tabs, csvDiff);
  }
}